

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFileSize(sqlite3_file *id,i64 *pSize)

{
  int *piVar1;
  undefined1 local_b8 [8];
  stat buf;
  int rc;
  i64 *pSize_local;
  sqlite3_file *id_local;
  
  buf.__glibc_reserved[2]._4_4_ = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_b8);
  if (buf.__glibc_reserved[2]._4_4_ == 0) {
    *pSize = buf.st_rdev;
    if (*pSize == 1) {
      *pSize = 0;
    }
    id_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *(int *)&id[4].pMethods = *piVar1;
    id_local._4_4_ = 0x70a;
  }
  return id_local._4_4_;
}

Assistant:

static int unixFileSize(sqlite3_file *id, i64 *pSize){
  int rc;
  struct stat buf;
  assert( id );
  rc = osFstat(((unixFile*)id)->h, &buf);
  SimulateIOError( rc=1 );
  if( rc!=0 ){
    ((unixFile*)id)->lastErrno = errno;
    return SQLITE_IOERR_FSTAT;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;


  return SQLITE_OK;
}